

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

void __thiscall test_app::test_views(test_app *this)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  undefined8 in_RDI;
  ostringstream oss_1;
  ostringstream oss;
  master m;
  char *in_stack_fffffffffffffaa8;
  master *in_stack_fffffffffffffab0;
  master *in_stack_fffffffffffffae0;
  allocator *paVar4;
  test_app *in_stack_fffffffffffffaf8;
  string local_4d0 [32];
  ostringstream local_4b0 [376];
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  undefined1 local_2e9;
  string local_2e8 [32];
  ostringstream local_2c8 [376];
  string local_150 [55];
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [248];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing different views");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  data::master::master(in_stack_fffffffffffffae0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"view_x",&local_119);
  cppcms::application::render(in_RDI,local_118,local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  str_abi_cxx11_(in_stack_fffffffffffffaf8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string(local_150);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2c8);
    poVar2 = std::operator<<((ostream *)local_2c8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/tc_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd3);
    std::operator<<(poVar2," str()==\"view x\"");
    local_2e9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2e8);
    local_2e9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar4 = &local_311;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"view_y",paVar4);
  cppcms::application::render(in_RDI,local_310,local_f8);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  str_abi_cxx11_(in_stack_fffffffffffffaf8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::__cxx11::string::~string(local_338);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4b0);
    poVar2 = std::operator<<((ostream *)local_4b0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/tc_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd5);
    std::operator<<(poVar2," str()==\"view y\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_4d0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  data::master::~master(in_stack_fffffffffffffab0);
  return;
}

Assistant:

void test_views()
	{
		std::cout << "- Testing different views" << std::endl;
		data::master m;
		render("view_x",m);
		TEST(str()=="view x");
		render("view_y",m);
		TEST(str()=="view y");
	}